

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

void __thiscall
CLI::IsMember::IsMember<char_const*>(IsMember *this,initializer_list<const_char_*> values)

{
  allocator_type local_29;
  vector<const_char_*,_std::allocator<const_char_*>_> local_28;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_28,values,&local_29);
  IsMember<std::vector<char_const*,std::allocator<char_const*>>>(this,&local_28);
  if (local_28.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

IsMember(std::initializer_list<T> values, Args &&...args)
        : IsMember(std::vector<T>(values), std::forward<Args>(args)...) {}